

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O0

Error __thiscall
asmjit::v1_14::BaseCompiler::newVirtReg
          (BaseCompiler *this,VirtReg **out,TypeId typeId,OperandSignature signature,char *name)

{
  Error EVar1;
  uint uVar2;
  VirtReg *this_00;
  undefined4 in_ECX;
  VirtReg in_DL;
  undefined8 *in_RSI;
  long in_RDI;
  BaseCompiler *in_R8;
  uint32_t alignment;
  uint32_t size;
  VirtReg *vReg;
  uint32_t index;
  VirtReg *in_stack_fffffffffffffee8;
  Zone *in_stack_fffffffffffffef0;
  ZoneAllocator *in_stack_fffffffffffffef8;
  Error err;
  VirtReg *size_00;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  uint uVar3;
  uint32_t maxEmbeddedSize;
  undefined4 in_stack_ffffffffffffff10;
  uint in_stack_ffffffffffffff14;
  uint uVar4;
  VirtReg *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff40;
  uint uVar5;
  Error local_94;
  
  *in_RSI = 0;
  uVar5 = *(uint *)(in_RDI + 0x1f0);
  if (uVar5 < 0xfffffeff) {
    EVar1 = ZoneVector<asmjit::v1_14::VirtReg_*>::willGrow
                      ((ZoneVector<asmjit::v1_14::VirtReg_*> *)
                       CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                       in_stack_fffffffffffffef8,
                       (uint32_t)((ulong)in_stack_fffffffffffffef0 >> 0x20));
    maxEmbeddedSize = (uint32_t)((ulong)in_RDI >> 0x20);
    err = (Error)((ulong)in_stack_fffffffffffffef8 >> 0x20);
    if (EVar1 == 0) {
      this_00 = Zone::allocZeroedT<asmjit::v1_14::VirtReg>
                          (in_stack_fffffffffffffef0,(size_t)in_stack_fffffffffffffee8,0x123002);
      if (this_00 == (VirtReg *)0x0) {
        DebugUtils::errored(1);
        local_94 = BaseEmitter::reportError
                             ((BaseEmitter *)
                              CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),err,
                              (char *)in_stack_fffffffffffffef0);
      }
      else {
        uVar2 = (uint)(byte)TypeUtils::_typeData[(ulong)(byte)in_DL + 0x100];
        uVar3 = uVar2;
        if (0x40 < uVar2) {
          uVar3 = 0x40;
        }
        uVar4 = in_stack_ffffffffffffff14 & 0xffffff;
        size_00 = (VirtReg *)0x0;
        if (this_00 != (VirtReg *)0x0) {
          uVar4 = CONCAT13(1,(int3)in_stack_ffffffffffffff14);
          *(undefined4 *)this_00 = in_ECX;
          *(uint *)(this_00 + 4) = uVar5 + 0x100;
          *(uint *)(this_00 + 8) = uVar2;
          this_00[0xc] = SUB41(uVar3,0);
          this_00[0xd] = in_DL;
          this_00[0xe] = (VirtReg)0x1;
          this_00[0xf] = (VirtReg)((byte)this_00[0xf] & 0xfe);
          this_00[0xf] = (VirtReg)((byte)this_00[0xf] & 0xfd);
          this_00[0xf] = (VirtReg)((byte)this_00[0xf] & 0xfb);
          this_00[0xf] = (VirtReg)((byte)this_00[0xf] & 7);
          *(undefined4 *)(this_00 + 0x10) = 0;
          *(undefined4 *)(this_00 + 0x14) = 0;
          *(undefined8 *)(this_00 + 0x18) = 0;
          *(undefined8 *)(this_00 + 0x20) = 0;
          *(undefined8 *)(this_00 + 0x28) = 0;
          in_stack_fffffffffffffee8 = this_00;
          size_00 = this_00;
          in_stack_ffffffffffffff10 = in_ECX;
          in_stack_ffffffffffffff18 = this_00;
        }
        if ((in_R8 == (BaseCompiler *)0x0) ||
           (*(char *)&(in_R8->super_BaseBuilder).super_BaseEmitter._vptr_BaseEmitter == '\0')) {
          BaseCompiler_assignGenericName(in_R8,(VirtReg *)CONCAT44(uVar5,in_stack_ffffffffffffff40))
          ;
        }
        else {
          ZoneStringBase::setData
                    ((ZoneStringBase *)in_stack_ffffffffffffff18,
                     (Zone *)CONCAT44(uVar4,in_stack_ffffffffffffff10),maxEmbeddedSize,
                     (char *)CONCAT44(uVar3,in_stack_ffffffffffffff00),(size_t)size_00);
        }
        ZoneVector<asmjit::v1_14::VirtReg_*>::appendUnsafe
                  ((ZoneVector<asmjit::v1_14::VirtReg_*> *)this_00,
                   (VirtReg **)in_stack_fffffffffffffee8);
        *in_RSI = size_00;
        local_94 = 0;
      }
    }
    else {
      DebugUtils::errored(1);
      local_94 = BaseEmitter::reportError
                           ((BaseEmitter *)
                            CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),err,
                            (char *)in_stack_fffffffffffffef0);
    }
  }
  else {
    DebugUtils::errored(0x3f);
    local_94 = BaseEmitter::reportError
                         ((BaseEmitter *)
                          CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                          (Error)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                          (char *)in_stack_fffffffffffffef0);
  }
  return local_94;
}

Assistant:

Error BaseCompiler::newVirtReg(VirtReg** out, TypeId typeId, OperandSignature signature, const char* name) {
  *out = nullptr;
  uint32_t index = _vRegArray.size();

  if (ASMJIT_UNLIKELY(index >= uint32_t(Operand::kVirtIdCount)))
    return reportError(DebugUtils::errored(kErrorTooManyVirtRegs));

  if (ASMJIT_UNLIKELY(_vRegArray.willGrow(&_allocator) != kErrorOk))
    return reportError(DebugUtils::errored(kErrorOutOfMemory));

  VirtReg* vReg = _vRegZone.allocZeroedT<VirtReg>();
  if (ASMJIT_UNLIKELY(!vReg))
    return reportError(DebugUtils::errored(kErrorOutOfMemory));

  uint32_t size = TypeUtils::sizeOf(typeId);
  uint32_t alignment = Support::min<uint32_t>(size, 64);

  vReg = new(Support::PlacementNew{vReg}) VirtReg(signature, Operand::indexToVirtId(index), size, alignment, typeId);

#ifndef ASMJIT_NO_LOGGING
  if (name && name[0] != '\0')
    vReg->_name.setData(&_dataZone, name, SIZE_MAX);
  else
    BaseCompiler_assignGenericName(this, vReg);
#else
  DebugUtils::unused(name);
#endif

  _vRegArray.appendUnsafe(vReg);
  *out = vReg;

  return kErrorOk;
}